

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

double MeCab::logsumexp(double x,double y,bool flg)

{
  undefined3 in_register_00000039;
  double dVar1;
  
  if (CONCAT31(in_register_00000039,flg) == 0) {
    dVar1 = y;
    if (x <= y) {
      dVar1 = x;
    }
    if (y <= x) {
      y = x;
    }
    if (y <= dVar1 + 50.0) {
      dVar1 = exp(dVar1 - y);
      dVar1 = log(dVar1 + 1.0);
      y = y + dVar1;
    }
  }
  return y;
}

Assistant:

inline double logsumexp(double x, double y, bool flg) {
#define MINUS_LOG_EPSILON  50

  if (flg) return y;  // init mode
  double vmin = std::min<double>(x, y);
  double vmax = std::max<double>(x, y);
  if (vmax > vmin + MINUS_LOG_EPSILON) {
    return vmax;
  } else {
    return vmax + std::log(std::exp(vmin - vmax) + 1.0);
  }
}